

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

uint64_t roaring_bitmap_and_cardinality(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  int iVar1;
  int iVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  int iVar5;
  uint64_t uVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  long *plVar10;
  ulong uVar11;
  uint uVar12;
  ushort uVar13;
  ushort uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  
  iVar1 = (x1->high_low_container).size;
  iVar2 = (x2->high_low_container).size;
  uVar18 = 0;
  if (0 < iVar2 && 0 < iVar1) {
    uVar16 = 0;
    do {
      puVar3 = (x1->high_low_container).keys;
      uVar17 = (uint)uVar18;
      uVar12 = uVar17 & 0xffff;
      uVar13 = puVar3[uVar12];
      puVar4 = (x2->high_low_container).keys;
      uVar15 = (uint)uVar16;
      uVar11 = (ulong)(uVar15 & 0xffff);
      uVar14 = puVar4[uVar11];
      if (uVar13 == uVar14) {
        bVar7 = (x1->high_low_container).typecodes[uVar12];
        if (bVar7 == 4) {
          bVar7 = *(byte *)((long)(x1->high_low_container).containers[uVar12] + 8);
        }
        bVar8 = (x2->high_low_container).typecodes[uVar11];
        plVar10 = (long *)(x2->high_low_container).containers[uVar11];
        if (bVar8 == 4) {
          bVar8 = *(byte *)(plVar10 + 1);
          plVar10 = (long *)*plVar10;
        }
        uVar6 = (*(code *)(&DAT_00129278 +
                          *(int *)(&DAT_00129278 + (ulong)(((uint)bVar8 + (uint)bVar7 * 4) - 5) * 4)
                          ))(uVar11,plVar10,&DAT_00129278,
                             &DAT_00129278 +
                             *(int *)(&DAT_00129278 +
                                     (ulong)(((uint)bVar8 + (uint)bVar7 * 4) - 5) * 4));
        return uVar6;
      }
      if (uVar13 < uVar14) {
        uVar15 = (x1->high_low_container).size;
        uVar12 = uVar17 + 1;
        if (((int)uVar12 < (int)uVar15) && (puVar3[(int)uVar12] < uVar14)) {
          uVar17 = uVar17 + 2;
          iVar9 = 1;
          if ((int)uVar17 < (int)uVar15) {
            iVar9 = 1;
            do {
              uVar18 = (ulong)uVar17;
              uVar13 = puVar3[(int)uVar17];
              if (uVar14 <= uVar13) goto LAB_0010f29c;
              iVar5 = iVar9 * 2;
              uVar17 = uVar12 + iVar9 * 2;
              iVar9 = iVar5;
            } while ((int)uVar17 < (int)uVar15);
          }
          uVar13 = puVar3[(long)(int)uVar15 + -1];
          uVar18 = (long)(int)uVar15 - 1;
LAB_0010f29c:
          if (uVar13 != uVar14) {
            if (uVar13 < uVar14) {
              uVar18 = (ulong)uVar15;
            }
            else if ((iVar9 >> 1) + uVar12 + 1 != (int)uVar18) {
              uVar12 = (iVar9 >> 1) + uVar12;
              do {
                uVar17 = (int)(uVar12 + (int)uVar18) >> 1;
                if (puVar3[(int)uVar17] == uVar14) {
                  uVar18 = (ulong)uVar17;
                  break;
                }
                if (uVar14 <= puVar3[(int)uVar17]) {
                  uVar18 = (ulong)uVar17;
                  uVar17 = uVar12;
                }
                uVar12 = uVar17;
              } while (uVar12 + 1 != (int)uVar18);
            }
          }
        }
        else {
          uVar18 = (ulong)uVar12;
        }
      }
      else {
        uVar17 = (x2->high_low_container).size;
        uVar12 = uVar15 + 1;
        if (((int)uVar12 < (int)uVar17) && (puVar4[(int)uVar12] < uVar13)) {
          uVar15 = uVar15 + 2;
          iVar9 = 1;
          if ((int)uVar15 < (int)uVar17) {
            iVar9 = 1;
            do {
              uVar16 = (ulong)uVar15;
              uVar14 = puVar4[(int)uVar15];
              if (uVar13 <= uVar14) goto LAB_0010f30b;
              iVar5 = iVar9 * 2;
              uVar15 = uVar12 + iVar9 * 2;
              iVar9 = iVar5;
            } while ((int)uVar15 < (int)uVar17);
          }
          uVar14 = puVar4[(long)(int)uVar17 + -1];
          uVar16 = (long)(int)uVar17 - 1;
LAB_0010f30b:
          if (uVar14 != uVar13) {
            if (uVar14 < uVar13) {
              uVar16 = (ulong)uVar17;
            }
            else if ((iVar9 >> 1) + uVar12 + 1 != (int)uVar16) {
              uVar12 = (iVar9 >> 1) + uVar12;
              do {
                uVar17 = (int)(uVar12 + (int)uVar16) >> 1;
                if (puVar4[(int)uVar17] == uVar13) {
                  uVar16 = (ulong)uVar17;
                  break;
                }
                if (uVar13 <= puVar4[(int)uVar17]) {
                  uVar16 = (ulong)uVar17;
                  uVar17 = uVar12;
                }
                uVar12 = uVar17;
              } while (uVar12 + 1 != (int)uVar16);
            }
          }
        }
        else {
          uVar16 = (ulong)uVar12;
        }
      }
    } while (((int)uVar18 < iVar1) && ((int)uVar16 < iVar2));
  }
  return 0;
}

Assistant:

uint64_t roaring_bitmap_and_cardinality(const roaring_bitmap_t *x1,
                                        const roaring_bitmap_t *x2) {
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    uint64_t answer = 0;
    int pos1 = 0, pos2 = 0;
    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 =
            ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
        const uint16_t s2 =
            ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            answer += container_and_cardinality(c1, type1, c2, type2);
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            pos1 = ra_advance_until(&x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
        }
    }
    return answer;
}